

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_register_progress_reporter
               (qpdf_data qpdf,_func_void_int_void_ptr *report_progress,void *data)

{
  element_type *this;
  FunctionProgressReporter *this_00;
  _Bind<void_(*(std::_Placeholder<1>,_void_*))(int,_void_*)> local_60;
  function<void_(int)> local_50;
  shared_ptr<QPDFWriter::ProgressReporter> local_30;
  void *local_20;
  void *data_local;
  _func_void_int_void_ptr *report_progress_local;
  qpdf_data qpdf_local;
  
  local_20 = data;
  data_local = report_progress;
  report_progress_local = (_func_void_int_void_ptr *)qpdf;
  QTC::TC("qpdf","qpdf-c registered progress reporter",0);
  this = std::__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    (report_progress_local + 0x10));
  this_00 = (FunctionProgressReporter *)operator_new(0x28);
  std::bind<void(*&)(int,void*),std::_Placeholder<1>const&,void*&>
            (&local_60._M_f,(_Placeholder<1> *)&data_local,(void **)&std::placeholders::_1);
  std::function<void(int)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,void*))(int,void*)>,void>
            ((function<void(int)> *)&local_50,&local_60);
  QPDFWriter::FunctionProgressReporter::FunctionProgressReporter(this_00,&local_50);
  std::shared_ptr<QPDFWriter::ProgressReporter>::
  shared_ptr<QPDFWriter::FunctionProgressReporter,void>(&local_30,this_00);
  QPDFWriter::registerProgressReporter(this,&local_30);
  std::shared_ptr<QPDFWriter::ProgressReporter>::~shared_ptr(&local_30);
  std::function<void_(int)>::~function(&local_50);
  return;
}

Assistant:

void
qpdf_register_progress_reporter(
    qpdf_data qpdf, void (*report_progress)(int percent, void* data), void* data)
{
    QTC::TC("qpdf", "qpdf-c registered progress reporter");
    qpdf->qpdf_writer->registerProgressReporter(
        std::shared_ptr<QPDFWriter::ProgressReporter>(new QPDFWriter::FunctionProgressReporter(
            std::bind(report_progress, std::placeholders::_1, data))));
}